

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O3

void __thiscall chrono::ChLinkPointSpline::UpdateTime(ChLinkPointSpline *this,double time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChLine *this_00;
  ChMarker *pCVar7;
  ChBodyFrame *pCVar8;
  element_type *peVar9;
  double dVar10;
  ulong uVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  bool bVar18;
  ChQuaternion<double> *pCVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double dVar85;
  double dVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double dVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  double dVar110;
  undefined1 auVar111 [16];
  double dVar112;
  undefined1 auVar113 [16];
  double dVar114;
  undefined1 auVar115 [16];
  Vector ptang;
  Vector ptang2;
  Vector vdir2;
  double mu;
  double local_140;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined1 local_b8 [16];
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double local_58;
  Coordsys local_50;
  
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj.ChTime = time;
  this_00 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (ChLine *)0x0) {
    return;
  }
  local_f8 = 0.0;
  local_c8 = 0.0;
  local_68 = 0.0;
  local_88 = 0.0;
  dVar47 = 0.0;
  dVar85 = 0.0;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  dVar30 = 0.0;
  pCVar7 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1;
  if (&(pCVar7->abs_frame).super_ChFrame<double>.coord != (ChCoordsys<double> *)local_b8) {
    dVar85 = (pCVar7->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
    dVar47 = (pCVar7->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
    dVar30 = (pCVar7->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  }
  pCVar8 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2;
  dVar47 = dVar47 - (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar85 = dVar85 - (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar30 = dVar30 - (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar85;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       dVar47 * (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar29 = vfmadd231sd_fma(auVar59,auVar53,auVar29);
  auVar48._0_8_ =
       dVar47 * (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar48._8_8_ =
       dVar47 * (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar54._8_8_ = dVar85;
  auVar54._0_8_ = dVar85;
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar30;
  auVar90 = vfmadd231sd_fma(auVar29,auVar31,auVar90);
  auVar32._8_8_ = dVar30;
  auVar32._0_8_ = dVar30;
  auVar29 = vfmadd132pd_fma(auVar54,auVar48,
                            *(undefined1 (*) [16])
                             (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  local_b8 = vfmadd132pd_fma(auVar32,auVar29,
                             *(undefined1 (*) [16])
                              ((pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 6));
  local_a8 = auVar90._0_8_;
  geometry::ChLine::FindNearestLinePoint
            (this_00,(ChVector<double> *)local_b8,&local_58,0.0,this->tolerance);
  dVar85 = local_58;
  peVar9 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar9->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar9,&local_108);
  peVar9 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar85;
  auVar29 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar79);
  (*(peVar9->super_ChGeometry)._vptr_ChGeometry[0xc])(auVar29._0_8_,peVar9,&local_78);
  peVar9 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_58 + 0.0001;
  auVar29 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar33);
  (*(peVar9->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar9,&local_d8);
  peVar9 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar9->super_ChGeometry)._vptr_ChGeometry[0xc])(auVar29._0_8_,peVar9,&local_98);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dStack_70;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dStack_90;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_78;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_98;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_68;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_88;
  auVar28 = ZEXT816(0x3ff0000000000000);
  auVar29 = vunpcklpd_avx(auVar67,auVar49);
  auVar90 = vunpcklpd_avx(auVar60,auVar34);
  auVar87._0_8_ = auVar29._0_8_ * auVar29._0_8_;
  auVar87._8_8_ = auVar29._8_8_ * auVar29._8_8_;
  auVar90 = vfmadd213pd_fma(auVar90,auVar90,auVar87);
  auVar29 = vunpcklpd_avx(auVar76,auVar55);
  auVar29 = vfmadd213pd_fma(auVar29,auVar29,auVar90);
  auVar90 = vsqrtpd_avx(auVar29);
  auVar13._8_8_ = 0x10000000000000;
  auVar13._0_8_ = 0x10000000000000;
  uVar11 = vcmppd_avx512vl(auVar90,auVar13,5);
  auVar29 = vshufpd_avx(auVar90,auVar90,1);
  dVar85 = 1.0 / auVar90._0_8_;
  dVar30 = 1.0 / auVar29._0_8_;
  uVar17 = (uVar11 & 3) >> 1;
  auVar20._0_8_ =
       (double)(uVar17 * (long)(local_78 * dVar30) + (ulong)!SUB81(uVar17,0) * 0x3ff0000000000000);
  auVar20._8_8_ = 0;
  bVar12 = (byte)(uVar11 & 3);
  auVar21._0_8_ =
       (double)((ulong)(bVar12 & 1) * (long)(local_98 * dVar85) +
               (ulong)!(bool)(bVar12 & 1) * 0x3ff0000000000000);
  auVar21._8_8_ = 0;
  local_68 = (double)(uVar17 * (long)(local_68 * dVar30));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_68;
  dStack_90 = (double)((ulong)(bVar12 & 1) * (long)(dStack_90 * dVar85));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dStack_90;
  dStack_70 = (double)(uVar17 * (long)(dStack_70 * dVar30));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dStack_70;
  local_88 = (double)((ulong)(bVar12 & 1) * (long)(local_88 * dVar85));
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_88;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_68 * auVar21._0_8_;
  auVar29 = vfmsub231sd_fma(auVar68,auVar20,auVar25);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dStack_70 * local_88;
  auVar90 = vfmsub231sd_fma(auVar61,auVar23,auVar22);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = auVar20._0_8_ * dStack_90;
  auVar79 = vfmsub231sd_fma(auVar77,auVar24,auVar21);
  dVar85 = auVar29._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar85 * dVar85;
  auVar29 = vfmadd231sd_fma(auVar88,auVar90,auVar90);
  auVar29 = vfmadd231sd_fma(auVar29,auVar79,auVar79);
  auVar29 = vsqrtsd_avx(auVar29,auVar29);
  if (1e-07 <= auVar29._0_8_) {
    dVar86 = 1.0 / auVar29._0_8_;
    dVar30 = auVar79._0_8_ * dVar86;
    dVar47 = auVar90._0_8_ * dVar86;
    dVar85 = dVar85 * dVar86;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar30 * auVar20._0_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar47;
    auVar29 = vfmsub231sd_fma(auVar80,auVar22,auVar103);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar85 * local_68;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar30;
    auVar90 = vfmsub231sd_fma(auVar70,auVar24,auVar107);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar85;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar47 * dStack_70;
    auVar79 = vfmsub231sd_fma(auVar91,auVar20,auVar63);
    dVar58 = auVar29._0_8_;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar58 * dVar58;
    auVar29 = vfmadd231sd_fma(auVar95,auVar90,auVar90);
    auVar29 = vfmadd231sd_fma(auVar29,auVar79,auVar79);
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar93 = 1.0 / auVar29._0_8_;
    bVar18 = 2.2250738585072014e-308 <= auVar29._0_8_;
    dVar86 = (double)((ulong)bVar18 * (long)(auVar90._0_8_ * dVar93) +
                     (ulong)!bVar18 * 0x3ff0000000000000);
    dVar58 = (double)((ulong)bVar18 * (long)(dVar58 * dVar93));
    dVar93 = (double)((ulong)bVar18 * (long)(auVar79._0_8_ * dVar93));
    dVar110 = auVar20._0_8_;
    local_140 = dVar93;
    local_e8 = dVar58;
    local_e0 = dVar86;
    dVar112 = dStack_70;
    dVar114 = local_68;
  }
  else {
    auVar27 = ZEXT816(0) << 0x40;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = VECT_Z;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = DAT_00b689e8;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = DAT_00b689f0;
    auVar62._0_8_ = -VECT_Z;
    auVar62._8_8_ = 0x8000000000000000;
    auVar78._0_8_ = -DAT_00b689e8;
    auVar78._8_8_ = 0x8000000000000000;
    auVar69._0_8_ = -DAT_00b689f0;
    auVar69._8_8_ = 0x8000000000000000;
    if ((((auVar20._0_8_ != 0.0) || (NAN(auVar20._0_8_))) || (dStack_70 != 0.0)) || (NAN(dStack_70))
       ) {
LAB_005a092a:
      auVar106._8_8_ = 0;
      auVar106._0_8_ = dStack_70 * dStack_70;
      auVar29 = vfmadd231sd_fma(auVar106,auVar20,auVar20);
      auVar29 = vfmadd231sd_fma(auVar29,auVar22,auVar22);
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      bVar18 = 2.2250738585072014e-308 <= auVar29._0_8_;
      dVar85 = 1.0 / auVar29._0_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = (ulong)bVar18 * (long)(dVar85 * local_68);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (ulong)bVar18 * (long)(dVar85 * dStack_70);
      auVar28._0_8_ =
           (ulong)bVar18 * (long)(dVar85 * auVar20._0_8_) + (ulong)!bVar18 * 0x3ff0000000000000;
      auVar28._8_8_ = 0;
    }
    else {
      auVar26 = ZEXT816(0) << 0x40;
      if ((local_68 != 0.0) || (NAN(local_68))) goto LAB_005a092a;
    }
    dVar114 = auVar26._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar114 * DAT_00b689e8;
    auVar29 = vfmadd213sd_fma(auVar69,auVar27,auVar35);
    dVar86 = auVar29._0_8_;
    dVar110 = auVar28._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar110 * DAT_00b689f0;
    auVar90 = vfmadd213sd_fma(auVar62,auVar26,auVar36);
    dVar112 = auVar27._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = VECT_Z * dVar112;
    auVar79 = vfmadd213sd_fma(auVar78,auVar28,auVar37);
    dVar93 = auVar79._0_8_;
    dVar58 = auVar90._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar58 * dVar58;
    auVar29 = vfmadd231sd_fma(auVar38,auVar29,auVar29);
    auVar29 = vfmadd231sd_fma(auVar29,auVar79,auVar79);
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar85 = auVar29._0_8_;
    if (dVar85 < 0.0001) {
      auVar14._8_8_ = 0x7fffffffffffffff;
      auVar14._0_8_ = 0x7fffffffffffffff;
      auVar29 = vandpd_avx512vl(auVar99,auVar14);
      if (0.9 <= auVar29._0_8_) {
        auVar15._8_8_ = 0x7fffffffffffffff;
        auVar15._0_8_ = 0x7fffffffffffffff;
        auVar29 = vandpd_avx512vl(auVar89,auVar15);
        if (0.9 <= auVar29._0_8_) {
          auVar16._8_8_ = 0x7fffffffffffffff;
          auVar16._0_8_ = 0x7fffffffffffffff;
          auVar29 = vandpd_avx512vl(auVar94,auVar16);
          auVar90 = ZEXT816(0);
          if (0.9 <= auVar29._0_8_) goto LAB_005a0acd;
          auVar29 = ZEXT816(0x3ff0000000000000);
        }
        else {
          auVar90 = ZEXT816(0x3ff0000000000000);
LAB_005a0acd:
          auVar29 = ZEXT816(0);
        }
        auVar79 = ZEXT816(0) << 0x40;
      }
      else {
        auVar79 = ZEXT816(0x3ff0000000000000);
        auVar29 = ZEXT816(0);
        auVar90 = ZEXT816(0);
      }
      auVar71._8_8_ = 0;
      auVar71._0_8_ = auVar90._0_8_ * -dVar114;
      auVar13 = vfmadd231sd_fma(auVar71,auVar27,auVar29);
      dVar86 = auVar13._0_8_;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auVar29._0_8_ * -dVar110;
      auVar29 = vfmadd231sd_fma(auVar64,auVar26,auVar79);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = auVar79._0_8_ * -dVar112;
      auVar90 = vfmadd231sd_fma(auVar81,auVar28,auVar90);
      dVar93 = auVar90._0_8_;
      dVar58 = auVar29._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar58 * dVar58;
      auVar29 = vfmadd231sd_fma(auVar39,auVar13,auVar13);
      auVar29 = vfmadd231sd_fma(auVar29,auVar90,auVar90);
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      dVar85 = auVar29._0_8_;
    }
    dVar85 = 1.0 / dVar85;
    dVar86 = dVar86 * dVar85;
    dVar58 = dVar58 * dVar85;
    dVar93 = dVar93 * dVar85;
    local_140 = 0.0;
    local_e8 = 0.0;
    local_e0 = 0.0;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = dVar58;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar112 * dVar93;
    auVar29 = vfmsub231sd_fma(auVar104,auVar100,auVar26);
    dVar47 = auVar29._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar114 * dVar86;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar93;
    auVar29 = vfmsub231sd_fma(auVar65,auVar72,auVar28);
    dVar85 = auVar29._0_8_;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = dVar86;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = dVar110 * dVar58;
    auVar29 = vfmsub231sd_fma(auVar108,auVar96,auVar27);
    dVar30 = auVar29._0_8_;
  }
  dVar10 = dVar110 + dVar85 + dVar93;
  local_98 = auVar21._0_8_;
  local_78 = auVar20._0_8_;
  if (0.0 <= dVar10) {
    dVar10 = dVar10 + 1.0;
    if (dVar10 < 0.0) {
      dVar85 = sqrt(dVar10);
    }
    else {
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar10;
      auVar29 = vsqrtsd_avx(auVar41,auVar41);
      dVar85 = auVar29._0_8_;
    }
    dVar93 = dVar85 * 0.5;
    dVar85 = 0.5 / dVar85;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = (dVar30 - dVar58) * dVar85;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = (dVar112 - dVar47) * dVar85;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (dVar86 - dVar114) * dVar85;
    goto LAB_005a0dcf;
  }
  if (dVar85 <= dVar110) {
    if (dVar110 < dVar93) goto LAB_005a0bae;
    dVar85 = ((dVar110 - dVar85) - dVar93) + 1.0;
    if (dVar85 < 0.0) {
      dVar85 = sqrt(dVar85);
    }
    else {
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar85;
      auVar29 = vsqrtsd_avx(auVar43,auVar43);
      dVar85 = auVar29._0_8_;
    }
    dVar93 = dVar30 - dVar58;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar85 * 0.5;
    dVar85 = 0.5 / dVar85;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (dVar47 + dVar112) * dVar85;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = (dVar114 + dVar86) * dVar85;
  }
  else if (dVar85 < dVar93) {
LAB_005a0bae:
    dVar85 = ((dVar93 - dVar110) - dVar85) + 1.0;
    if (dVar85 < 0.0) {
      dVar85 = sqrt(dVar85);
    }
    else {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar85;
      auVar29 = vsqrtsd_avx(auVar42,auVar42);
      dVar85 = auVar29._0_8_;
    }
    dVar93 = dVar112 - dVar47;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar85 * 0.5;
    dVar85 = 0.5 / dVar85;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = (dVar114 + dVar86) * dVar85;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (dVar58 + dVar30) * dVar85;
  }
  else {
    dVar85 = ((dVar85 - dVar93) - dVar110) + 1.0;
    if (dVar85 < 0.0) {
      dVar85 = sqrt(dVar85);
    }
    else {
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar85;
      auVar29 = vsqrtsd_avx(auVar40,auVar40);
      dVar85 = auVar29._0_8_;
    }
    dVar93 = dVar86 - dVar114;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar85 * 0.5;
    dVar85 = 0.5 / dVar85;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = (dVar58 + dVar30) * dVar85;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = (dVar47 + dVar112) * dVar85;
  }
  dVar93 = dVar93 * dVar85;
LAB_005a0dcf:
  pCVar8 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_108;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = local_f8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       dStack_100 *
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar29 = vfmadd231sd_fma(auVar92,auVar44,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       dStack_100 *
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar90 = vfmadd231sd_fma(auVar101,auVar44,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       dStack_100 *
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar79 = vfmadd231sd_fma(auVar82,auVar44,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar29 = vfmadd231sd_fma(auVar29,auVar97,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar90 = vfmadd231sd_fma(auVar90,auVar97,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar79 = vfmadd231sd_fma(auVar79,auVar97,auVar6);
  local_108 = auVar29._0_8_ +
              (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dStack_100 = auVar90._0_8_ +
               (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_f8 = auVar79._0_8_ +
             (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dVar85 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar85;
  dVar30 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar30;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar47 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar47;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar93;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = auVar56._0_8_ * dVar85;
  auVar13 = vfmsub231sd_fma(auVar105,auVar83,auVar73);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar93 * dVar85;
  auVar29 = vfmadd231sd_fma(auVar113,auVar83,auVar56);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar30 * dVar93;
  auVar90 = vfmadd231sd_fma(auVar115,auVar83,auVar50);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar47 * dVar93;
  auVar79 = vfmadd231sd_fma(auVar74,auVar83,auVar66);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar109,auVar50);
  auVar28 = vfnmadd231sd_fma(auVar29,auVar111,auVar50);
  auVar29 = vfmadd231sd_fma(auVar90,auVar111,auVar56);
  auVar79 = vfnmadd231sd_fma(auVar79,auVar109,auVar56);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar111,auVar66);
  auVar90 = vfmadd231sd_fma(auVar28,auVar109,auVar66);
  auVar28 = vfnmadd231sd_fma(auVar29,auVar98,auVar66);
  auVar29 = vfmadd231sd_fma(auVar79,auVar98,auVar50);
  local_50.rot.m_data[0] = auVar13._0_8_;
  local_50.rot.m_data[1] = auVar90._0_8_;
  local_50.rot.m_data[2] = auVar28._0_8_;
  local_50.rot.m_data[3] = auVar29._0_8_;
  local_50.pos.m_data[0] = local_108;
  local_50.pos.m_data[1] = dStack_100;
  local_50.pos.m_data[2] = local_f8;
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_50);
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->motion_type =
       M_MOTION_EXTERNAL;
  dVar85 = DAT_00b689a0;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_108 - local_d8;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = (dStack_100 - dStack_d0) * (dStack_100 - dStack_d0);
  auVar29 = vfmadd231sd_fma(auVar84,auVar75,auVar75);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_f8 - local_c8;
  auVar29 = vfmadd231sd_fma(auVar29,auVar102,auVar102);
  auVar29 = vsqrtsd_avx(auVar29,auVar29);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_e0;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_d8 - local_108;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = (dStack_d0 - dStack_100) * local_e8;
  auVar90 = vfmadd213sd_fma(auVar57,auVar45,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_140;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_c8 - local_f8;
  auVar90 = vfmadd213sd_fma(auVar52,auVar46,auVar90);
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2880)) {
    (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = dVar85;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = DAT_00b689a8;
  }
  dVar85 = DAT_00b689a0;
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2848)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = dVar85;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_00b689a8;
  }
  pCVar19 = &(this->super_ChLinkLockLock).deltaC.rot;
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = 0.0;
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = 0.0;
  dVar85 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[0];
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] =
       (dVar85 * dVar85) / ((auVar29._0_8_ * auVar29._0_8_) / (auVar90._0_8_ + auVar90._0_8_));
  dVar47 = DAT_00b68868;
  dVar30 = DAT_00b68860;
  dVar85 = DAT_00b68858;
  if (pCVar19 != (ChQuaternion<double> *)&QUNIT) {
    pCVar19->m_data[0] = QUNIT;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = dVar85;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = dVar30;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = dVar47;
  }
  dVar47 = DAT_00b68848;
  dVar30 = DAT_00b68840;
  dVar85 = DAT_00b68838;
  pCVar19 = &(this->super_ChLinkLockLock).deltaC_dt.rot;
  if (pCVar19 != (ChQuaternion<double> *)&QNULL) {
    pCVar19->m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = dVar85;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = dVar30;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = dVar47;
  }
  dVar47 = DAT_00b68848;
  dVar30 = DAT_00b68840;
  dVar85 = DAT_00b68838;
  pCVar19 = &(this->super_ChLinkLockLock).deltaC_dtdt.rot;
  if (pCVar19 != (ChQuaternion<double> *)&QNULL) {
    pCVar19->m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = dVar85;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = dVar30;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = dVar47;
  }
  return;
}

Assistant:

void ChLinkPointSpline::UpdateTime(double time) {
    ChTime = time;

    if (trajectory_line) {
        Vector param, ptang, ptang2, vdir, vdir2, vnorm, vrad, vpoint;
        double mu, ds, dh, mrad;

        // find nearest point
        vpoint = marker1->GetAbsCoord().pos;
        vpoint = Body2->TransformPointParentToLocal(vpoint);
        trajectory_line->FindNearestLinePoint(vpoint, mu, 0, tolerance);

        param.y() = 0;
        param.z() = 0;
        param.x() = mu;
        trajectory_line->Evaluate(ptang, param.x());

        if (param.x() < 0)
            param.x() = 0;
        trajectory_line->Derive(vdir, param.x());

        param.x() = mu + BDF_STEP_HIGH;
        if (param.x() > 1)
            param.x() = 1;
        trajectory_line->Evaluate(ptang2, param.x());

        trajectory_line->Derive(vdir2, param.x());

        ChMatrix33<> ma;

        vdir = Vnorm(vdir);
        vdir2 = Vnorm(vdir2);
        vnorm = Vcross(vdir2, vdir);
        if (vnorm.Length() < 1e-7) {
            // on a straight segment, no curvature, so define normal and radial by these:
            ma.Set_A_Xdir(vdir, -VECT_Z);
        } else {
            vnorm.Normalize();
            vrad = Vnorm(Vcross(vdir, vnorm));
            ma.Set_A_axis(vdir, vnorm, vrad);
        }
        Quaternion qabsdir = ma.Get_A_quaternion();

        ptang = Body2->TransformPointLocalToParent(ptang);
        qabsdir = Body2->GetRot() * qabsdir;

        Coordsys newmarkpos;
        newmarkpos.pos = ptang;
        newmarkpos.rot = qabsdir;
        marker2->Impose_Abs_Coord(newmarkpos);  // move "main" marker2 into tangent position
        marker2->SetMotionType(
            ChMarker::M_MOTION_EXTERNAL);  // the BDF routine won't handle speed and acc.calculus of the moved marker!

        ds = Vlength(Vsub(ptang, ptang2));
        dh = Vdot(Vsub(ptang2, ptang), vrad);
        mrad = ((ds * ds) / (2 * dh));  // radius of curvature on spline

        ChMatrix33<> mw;
        mw.Set_A_quaternion(marker2->GetAbsCoord().rot);

        deltaC.pos = VNULL;
        deltaC_dt.pos = VNULL;
        deltaC_dtdt.pos.x() = 0;  // csys X axis aligned to vdir: just
        deltaC_dtdt.pos.y() = 0;  // impose centripetal acceleration
        // deltaC_dtdt.pos.z() =   pow(Vdot(this->GetRelM_dt().pos, vdir), 2) / mrad;
        deltaC_dtdt.pos.z() = pow(GetRelM_dt().pos.x(), 2) / mrad;

        deltaC.rot = QUNIT;
        deltaC_dt.rot = QNULL;
        deltaC_dtdt.rot = QNULL;
    }
}